

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolu.c
# Opt level: O3

int ffpprn(fitsfile *fptr,LONGLONG firstelem,LONGLONG nelem,int *status)

{
  int iVar1;
  
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 == 0) {
    ffpclu(fptr,2,1,firstelem,nelem,status);
    iVar1 = *status;
  }
  else {
    ffpmsg("writing to compressed image is not supported");
    *status = 0x19d;
    iVar1 = 0x19d;
  }
  return iVar1;
}

Assistant:

int ffpprn( fitsfile *fptr,  /* I - FITS file pointer                       */
            LONGLONG  firstelem,  /* I - first vector element to write(1 = 1st) */
            LONGLONG  nelem,      /* I - number of values to write              */
            int  *status)     /* IO - error status                          */
/*
  Write null values to the primary array. (Doesn't support groups).

*/
{
    long row = 1;

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        ffpmsg("writing to compressed image is not supported");

        return(*status = DATA_COMPRESSION_ERR);
    }

    ffpclu(fptr, 2, row, firstelem, nelem, status);
    return(*status);
}